

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assert.cpp
# Opt level: O0

void slang::assert::assertFailed(char *expr,char *file,int line,char *func)

{
  AssertionException *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  v9 *local_168 [2];
  string local_158;
  char *local_138;
  char *func_local;
  char *pcStack_128;
  int line_local;
  char *file_local;
  char *expr_local;
  undefined1 local_d8 [16];
  v9 *local_c8;
  char *local_c0;
  char **local_b8;
  char **local_b0;
  char **local_a8;
  v9 *local_a0;
  v9 *local_98;
  char *pcStack_90;
  string *local_88;
  char *local_80;
  v9 **local_78;
  v9 **local_70;
  v9 *local_68;
  char *pcStack_60;
  char **local_50;
  undefined1 *local_48;
  char **local_40;
  char **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  char *local_20;
  v9 **local_18;
  char *local_10;
  
  local_138 = func;
  func_local._4_4_ = line;
  pcStack_128 = file;
  file_local = expr;
  this = (AssertionException *)__cxa_allocate_exception(0x10);
  local_78 = local_168;
  local_80 = "Assertion \'{}\' failed\n  in file {}, line {}\n  function: {}\n";
  local_20 = "Assertion \'{}\' failed\n  in file {}, line {}\n  function: {}\n";
  local_168[0] = (v9 *)0x6dffa9;
  local_18 = local_78;
  local_c0 = (char *)std::char_traits<char>::length
                               ("Assertion \'{}\' failed\n  in file {}, line {}\n  function: {}\n");
  local_10 = local_80;
  local_88 = &local_158;
  local_98 = local_168[0];
  local_a0 = (v9 *)&file_local;
  local_a8 = &stack0xfffffffffffffed8;
  local_b0 = (char **)((long)&func_local + 4);
  local_b8 = &local_138;
  local_70 = &local_98;
  local_c8 = local_168[0];
  pcStack_90 = local_c0;
  local_68 = local_c8;
  pcStack_60 = local_c0;
  ::fmt::v9::
  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char_const*&,char_const*&,int&,char_const*&>
            ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_const_char_*,_const_char_*,_int,_const_char_*>
              *)&expr_local,local_a0,local_a8,local_b0,(int *)local_b8,(char **)in_R9.values_);
  local_48 = local_d8;
  local_50 = &expr_local;
  local_30 = 0xc1cc;
  fmt.size_ = 0xc1cc;
  fmt.data_ = local_c0;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_50;
  local_40 = local_50;
  local_38 = local_50;
  local_28 = local_48;
  ::fmt::v9::vformat_abi_cxx11_(&local_158,local_c8,fmt,args);
  AssertionException::AssertionException(this,&local_158);
  __cxa_throw(this,&AssertionException::typeinfo,AssertionException::~AssertionException);
}

Assistant:

[[noreturn]] void assertFailed(const char* expr, const char* file, int line, const char* func) {
    throw AssertionException(fmt::format("Assertion '{}' failed\n  in file {}, line {}\n"
                                         "  function: {}\n",
                                         expr, file, line, func));
}